

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_set_samples(bcf_hdr_t *hdr,char *samples,int is_file)

{
  int iVar1;
  khint_t kVar2;
  void *pvVar3;
  char *pcVar4;
  char *local_70;
  int local_58;
  int k_1;
  int ignore;
  int k;
  vdict_t *d;
  char **samples_1;
  char **smpls;
  int ret;
  int n;
  int idx;
  int narr;
  int i;
  int is_file_local;
  char *samples_local;
  bcf_hdr_t *hdr_local;
  
  narr = is_file;
  _i = samples;
  samples_local = (char *)hdr;
  if ((samples == (char *)0x0) || (iVar1 = strcmp("-",samples), iVar1 != 0)) {
    *(undefined4 *)(samples_local + 0x70) = *(undefined4 *)(samples_local + 8);
    if (_i == (char *)0x0) {
      samples_local[8] = '\0';
      samples_local[9] = '\0';
      samples_local[10] = '\0';
      samples_local[0xb] = '\0';
      hdr_local._4_4_ = 0;
    }
    else {
      n = *(int *)(samples_local + 8) / 8 + 1;
      pvVar3 = calloc((long)n,1);
      *(void **)(samples_local + 0x78) = pvVar3;
      if (*_i == '^') {
        for (idx = 0; idx < *(int *)(samples_local + 8); idx = idx + 1) {
          *(byte *)(*(long *)(samples_local + 0x78) + (long)(idx / 8)) =
               *(byte *)(*(long *)(samples_local + 0x78) + (long)(idx / 8)) |
               (byte)(1 << ((byte)((long)idx % 8) & 0x1f));
        }
      }
      smpls._0_4_ = 0;
      if (*_i == '^') {
        local_70 = _i + 1;
      }
      else {
        local_70 = _i;
      }
      samples_1 = hts_readlist(local_70,narr,(int *)((long)&smpls + 4));
      if (samples_1 == (char **)0x0) {
        hdr_local._4_4_ = -1;
      }
      else {
        for (idx = 0; idx < smpls._4_4_; idx = idx + 1) {
          ret = bcf_hdr_id2int((bcf_hdr_t *)samples_local,2,samples_1[idx]);
          if (ret < 0) {
            if ((int)smpls == 0) {
              smpls._0_4_ = idx + 1;
            }
          }
          else {
            if (*(int *)(samples_local + 8) <= ret) {
              __assert_fail("idx<bcf_hdr_nsamples(hdr)",
                            "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                            ,0x9a6,"int bcf_hdr_set_samples(bcf_hdr_t *, const char *, int)");
            }
            if (*_i == '^') {
              *(byte *)(*(long *)(samples_local + 0x78) + (long)(ret / 8)) =
                   *(byte *)(*(long *)(samples_local + 0x78) + (long)(ret / 8)) &
                   ((byte)(1 << ((byte)((long)ret % 8) & 0x1f)) ^ 0xff);
            }
            else {
              *(byte *)(*(long *)(samples_local + 0x78) + (long)(ret / 8)) =
                   *(byte *)(*(long *)(samples_local + 0x78) + (long)(ret / 8)) |
                   (byte)(1 << ((byte)((long)ret % 8) & 0x1f));
            }
          }
        }
        for (idx = 0; idx < smpls._4_4_; idx = idx + 1) {
          free(samples_1[idx]);
        }
        free(samples_1);
        samples_local[8] = '\0';
        samples_local[9] = '\0';
        samples_local[10] = '\0';
        samples_local[0xb] = '\0';
        for (idx = 0; idx < *(int *)(samples_local + 0x70); idx = idx + 1) {
          if (((uint)*(byte *)(*(long *)(samples_local + 0x78) + (long)(idx / 8)) &
              1 << ((byte)((long)idx % 8) & 0x1f)) != 0) {
            *(int *)(samples_local + 8) = *(int *)(samples_local + 8) + 1;
          }
        }
        if (*(int *)(samples_local + 8) == 0) {
          free(*(void **)(samples_local + 0x78));
          samples_local[0x78] = '\0';
          samples_local[0x79] = '\0';
          samples_local[0x7a] = '\0';
          samples_local[0x7b] = '\0';
          samples_local[0x7c] = '\0';
          samples_local[0x7d] = '\0';
          samples_local[0x7e] = '\0';
          samples_local[0x7f] = '\0';
        }
        else {
          d = (vdict_t *)malloc((long)*(int *)(samples_local + 8) << 3);
          ret = 0;
          for (idx = 0; idx < *(int *)(samples_local + 0x70); idx = idx + 1) {
            if (((uint)*(byte *)(*(long *)(samples_local + 0x78) + (long)(idx / 8)) &
                1 << ((byte)((long)idx % 8) & 0x1f)) != 0) {
              pcVar4 = strdup(*(char **)(*(long *)(samples_local + 0x40) + (long)idx * 8));
              *(char **)(&d->n_buckets + (long)ret * 2) = pcVar4;
              ret = ret + 1;
            }
          }
          free(*(void **)(samples_local + 0x40));
          *(vdict_t **)(samples_local + 0x40) = d;
          _ignore = *(kh_vdict_t **)(samples_local + 0x38);
          for (k_1 = 0; k_1 != _ignore->n_buckets; k_1 = k_1 + 1) {
            if ((_ignore->flags[k_1 >> 4] >> (sbyte)((k_1 & 0xfU) << 1) & 3) == 0) {
              free(_ignore->keys[k_1]);
            }
          }
          kh_destroy_vdict(_ignore);
          _ignore = kh_init_vdict();
          *(kh_vdict_t **)(samples_local + 0x38) = _ignore;
          for (idx = 0; idx < *(int *)(samples_local + 8); idx = idx + 1) {
            kVar2 = kh_put_vdict(_ignore,*(kh_cstr_t *)
                                          (*(long *)(samples_local + 0x40) + (long)idx * 8),
                                 &local_58);
            memcpy(_ignore->vals + (int)kVar2,&bcf_idinfo_def,0x30);
            _ignore->vals[(int)kVar2].id = _ignore->size - 1;
          }
          bcf_hdr_sync((bcf_hdr_t *)samples_local);
        }
        hdr_local._4_4_ = (int)smpls;
      }
    }
  }
  else {
    hdr_local._4_4_ = 0;
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_hdr_set_samples(bcf_hdr_t *hdr, const char *samples, int is_file)
{
    if ( samples && !strcmp("-",samples) ) return 0;            // keep all samples

    hdr->nsamples_ori = bcf_hdr_nsamples(hdr);
    if ( !samples ) { bcf_hdr_nsamples(hdr) = 0; return 0; }    // exclude all samples

    int i, narr = bit_array_size(bcf_hdr_nsamples(hdr));
    hdr->keep_samples = (uint8_t*) calloc(narr,1);
    if ( samples[0]=='^' )
        for (i=0; i<bcf_hdr_nsamples(hdr); i++) bit_array_set(hdr->keep_samples,i);

    int idx, n, ret = 0;
    char **smpls = hts_readlist(samples[0]=='^'?samples+1:samples, is_file, &n);
    if ( !smpls ) return -1;
    for (i=0; i<n; i++)
    {
        idx = bcf_hdr_id2int(hdr,BCF_DT_SAMPLE,smpls[i]);
        if ( idx<0 )
        {
            if ( !ret ) ret = i+1;
            continue;
        }
        assert( idx<bcf_hdr_nsamples(hdr) );
        if (  samples[0]=='^' )
            bit_array_clear(hdr->keep_samples, idx);
        else
            bit_array_set(hdr->keep_samples, idx);
    }
    for (i=0; i<n; i++) free(smpls[i]);
    free(smpls);

    bcf_hdr_nsamples(hdr) = 0;
    for (i=0; i<hdr->nsamples_ori; i++)
        if ( bit_array_test(hdr->keep_samples,i) ) bcf_hdr_nsamples(hdr)++;
    if ( !bcf_hdr_nsamples(hdr) ) { free(hdr->keep_samples); hdr->keep_samples=NULL; }
    else
    {
        char **samples = (char**) malloc(sizeof(char*)*bcf_hdr_nsamples(hdr));
        idx = 0;
        for (i=0; i<hdr->nsamples_ori; i++)
            if ( bit_array_test(hdr->keep_samples,i) ) samples[idx++] = strdup(hdr->samples[i]);
        free(hdr->samples);
        hdr->samples = samples;

        // delete original samples from the dictionary
        vdict_t *d = (vdict_t*)hdr->dict[BCF_DT_SAMPLE];
        int k;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);

        // add the subset back
        hdr->dict[BCF_DT_SAMPLE] = d = kh_init(vdict);
        for (i=0; i<bcf_hdr_nsamples(hdr); i++)
        {
            int ignore, k = kh_put(vdict, d, hdr->samples[i], &ignore);
            kh_val(d, k) = bcf_idinfo_def;
            kh_val(d, k).id = kh_size(d) - 1;
        }
        bcf_hdr_sync(hdr);
    }

    return ret;
}